

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfcn.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  vector<Object,_std::allocator<Object>_> *objects_00;
  Allocator **ppAVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  char *pcVar6;
  pointer pOVar7;
  pointer pOVar8;
  int iVar9;
  int *piVar10;
  bool bVar11;
  void *pvVar12;
  char cVar13;
  int iVar14;
  long lVar15;
  ulong uVar16;
  float *pfVar17;
  size_t sVar18;
  uint uVar19;
  long lVar20;
  size_type __new_size;
  long lVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar29;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar43;
  float fVar44;
  undefined1 auVar42 [16];
  float fVar45;
  vector<Object,_std::allocator<Object>_> objects;
  vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
  class_candidates;
  Extractor ex1;
  Mat bbox_pred;
  Mat m_1;
  Mat rois;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  Mat cls_prob;
  Mat im_info;
  Mat rfcn_bbox;
  value_type local_2b8;
  Mat in;
  Mat rfcn_cls;
  Extractor ex2;
  Mat m;
  int local_1a0;
  int iStack_19c;
  uchar *local_198;
  Net rfcn;
  float mean_vals [3];
  
  if (argc == 2) {
    pcVar6 = argv[1];
    std::__cxx11::string::string((string *)&rfcn,pcVar6,(allocator *)&in);
    cv::imread((string *)&m,(int)&rfcn);
    if ((Allocator **)rfcn._vptr_Net != &rfcn.opt.blob_allocator) {
      operator_delete(rfcn._vptr_Net);
    }
    cVar13 = cv::Mat::empty();
    if (cVar13 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&rfcn);
      rfcn.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&rfcn,"rfcn_end2end.param");
      ncnn::Net::load_model(&rfcn,"rfcn_end2end.bin");
      if (iStack_19c < local_1a0) {
        local_3b8._4_4_ = 224.0 / (float)iStack_19c;
        iVar22 = (int)((float)local_1a0 * (float)local_3b8._4_4_);
        iVar14 = 0xe0;
      }
      else {
        local_3b8._4_4_ = 224.0 / (float)local_1a0;
        iVar14 = (int)((float)iStack_19c * (float)local_3b8._4_4_);
        iVar22 = 0xe0;
      }
      ncnn::Mat::from_pixels_resize
                (&in,local_198,2,iStack_19c,local_1a0,iVar14,iVar22,(Allocator *)0x0);
      mean_vals[0] = 102.9801;
      mean_vals[1] = 115.9465;
      mean_vals[2] = 122.7717;
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      im_info.cstep = 0;
      im_info.data = (void *)0x0;
      im_info.refcount._0_4_ = 0;
      im_info.refcount._4_4_ = 0;
      im_info.elemsize._0_4_ = 0;
      im_info.elemsize._4_4_ = 0;
      im_info.elempack = 0;
      im_info.allocator = (Allocator *)0x0;
      im_info.dims = 0;
      im_info.w = 0;
      im_info.h = 0;
      im_info.d = 0;
      im_info.c = 0;
      ncnn::Mat::create(&im_info,3,4,(Allocator *)0x0);
      *(float *)im_info.data = (float)iVar22;
      *(float *)((long)im_info.data + 4) = (float)iVar14;
      *(undefined4 *)((long)im_info.data + 8) = local_3b8._4_4_;
      ncnn::Net::create_extractor((Net *)&ex1);
      ncnn::Extractor::input(&ex1,"data",&in);
      ncnn::Extractor::input(&ex1,"im_info",&im_info);
      rfcn_cls.cstep = 0;
      rfcn_cls.data = (void *)0x0;
      rfcn_cls.refcount._0_4_ = 0;
      rfcn_cls.refcount._4_4_ = 0;
      rfcn_cls.elemsize._0_4_ = 0;
      rfcn_cls.elemsize._4_4_ = 0;
      rfcn_cls.elempack = 0;
      rfcn_cls.allocator = (Allocator *)0x0;
      rfcn_cls.dims = 0;
      rfcn_cls.w = 0;
      rfcn_cls.h = 0;
      rfcn_cls.d = 0;
      rfcn_cls.c = 0;
      rfcn_bbox.cstep = 0;
      rfcn_bbox.data = (void *)0x0;
      rfcn_bbox.refcount._0_4_ = 0;
      rfcn_bbox.refcount._4_4_ = 0;
      rfcn_bbox.elemsize._0_4_ = 0;
      rfcn_bbox.elemsize._4_4_ = 0;
      rfcn_bbox.elempack = 0;
      rfcn_bbox.allocator = (Allocator *)0x0;
      rfcn_bbox.dims = 0;
      rfcn_bbox.w = 0;
      rfcn_bbox.h = 0;
      rfcn_bbox.d = 0;
      rfcn_bbox.c = 0;
      rois.cstep = 0;
      rois.data = (void *)0x0;
      rois.refcount._0_4_ = 0;
      rois.refcount._4_4_ = 0;
      rois.elemsize._0_4_ = 0;
      rois.elemsize._4_4_ = 0;
      rois.elempack = 0;
      rois.allocator = (Allocator *)0x0;
      rois.dims = 0;
      rois.w = 0;
      rois.h = 0;
      rois.d = 0;
      rois.c = 0;
      ncnn::Extractor::extract(&ex1,"rfcn_cls",&rfcn_cls,0);
      ncnn::Extractor::extract(&ex1,"rfcn_bbox",&rfcn_bbox,0);
      ncnn::Extractor::extract(&ex1,"rois",&rois,0);
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      class_candidates.
      super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < rois.c) {
        local_3b8._0_4_ = local_3b8._4_4_;
        fStack_3b0 = (float)local_3b8._4_4_;
        fStack_3ac = (float)local_3b8._4_4_;
        lVar21 = 0;
        do {
          ncnn::Net::create_extractor((Net *)&ex2);
          if (rois.dims == 3) {
            lVar15 = rois.cstep * lVar21 * CONCAT44(rois.elemsize._4_4_,(undefined4)rois.elemsize);
            m_1.dims = 2;
            m_1.c = 1;
          }
          else {
            lVar15 = rois.cstep * lVar21 * CONCAT44(rois.elemsize._4_4_,(undefined4)rois.elemsize);
            m_1.dims = 3;
            m_1.c = rois.d;
          }
          m_1.data = (void *)(lVar15 + (long)rois.data);
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = (undefined4)rois.elemsize;
          m_1.elemsize._4_4_ = rois.elemsize._4_4_;
          m_1.elempack = rois.elempack;
          m_1.allocator = rois.allocator;
          m_1.w = rois.w;
          m_1.d = 1;
          m_1.h = rois.h;
          m_1.cstep = (long)rois.h * (long)rois.w;
          ncnn::Extractor::input(&ex2,"rfcn_cls",&rfcn_cls);
          ncnn::Extractor::input(&ex2,"rfcn_bbox",&rfcn_bbox);
          ncnn::Extractor::input(&ex2,"rois",&m_1);
          bbox_pred.cstep = 0;
          bbox_pred.data = (void *)0x0;
          bbox_pred.refcount._0_4_ = 0;
          bbox_pred.refcount._4_4_ = 0;
          bbox_pred.elemsize._0_4_ = 0;
          bbox_pred.elemsize._4_4_ = 0;
          bbox_pred.elempack = 0;
          bbox_pred.h = 0;
          bbox_pred.d = 0;
          bbox_pred.c = 0;
          bbox_pred.allocator = (Allocator *)0x0;
          bbox_pred.dims = 0;
          bbox_pred.w = 0;
          cls_prob.cstep = 0;
          cls_prob.data = (void *)0x0;
          cls_prob.refcount._0_4_ = 0;
          cls_prob.refcount._4_4_ = 0;
          cls_prob.elemsize._0_4_ = 0;
          cls_prob._20_8_ = 0;
          cls_prob.h = 0;
          cls_prob.d = 0;
          cls_prob.c = 0;
          cls_prob.allocator = (Allocator *)0x0;
          cls_prob.dims = 0;
          cls_prob.w = 0;
          ncnn::Extractor::extract(&ex2,"bbox_pred",&bbox_pred,0);
          ncnn::Extractor::extract(&ex2,"cls_prob",&cls_prob,0);
          iVar14 = cls_prob.w;
          __new_size = (size_type)cls_prob.w;
          std::
          vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
          ::resize(&class_candidates,__new_size);
          pvVar12 = bbox_pred.data;
          if (iVar14 < 1) {
            iVar14 = 0;
            fVar37 = 0.0;
          }
          else {
            uVar16 = 0;
            uVar24 = 0;
            fVar26 = 0.0;
            do {
              fVar37 = *(float *)((long)cls_prob.data + uVar16 * 4);
              if (fVar26 < fVar37) {
                uVar24 = uVar16 & 0xffffffff;
              }
              iVar14 = (int)uVar24;
              if (fVar37 <= fVar26) {
                fVar37 = fVar26;
              }
              uVar16 = uVar16 + 1;
              fVar26 = fVar37;
            } while (__new_size != uVar16);
          }
          if ((iVar14 != 0) && (0.6 < fVar37)) {
            uVar16 = *m_1.data;
            uVar24 = *(ulong *)((long)m_1.data + 8);
            fVar26 = *(float *)((long)bbox_pred.data + 0x1c);
            fVar25 = expf(*(float *)((long)bbox_pred.data + 0x18));
            fVar26 = expf(fVar26);
            auVar35._8_8_ = 0;
            auVar35._0_8_ = uVar16;
            auVar35 = divps(auVar35,_local_3b8);
            auVar42._8_8_ = 0;
            auVar42._0_8_ = uVar24;
            auVar42 = divps(auVar42,_local_3b8);
            fVar41 = (auVar42._0_4_ - auVar35._0_4_) + (float)DAT_00316020;
            fVar43 = (auVar42._4_4_ - auVar35._4_4_) + DAT_00316020._4_4_;
            fVar44 = (auVar42._8_4_ - auVar35._8_4_) + DAT_00316020._8_4_;
            fVar45 = (auVar42._12_4_ - auVar35._12_4_) + DAT_00316020._12_4_;
            fVar29 = (float)*(undefined8 *)((long)pvVar12 + 0x10) * fVar41 +
                     fVar41 * 0.5 + auVar35._0_4_;
            fVar32 = (float)((ulong)*(undefined8 *)((long)pvVar12 + 0x10) >> 0x20) * fVar43 +
                     fVar43 * 0.5 + auVar35._4_4_;
            fVar33 = fVar44 * 0.0 + fVar44 * 0.0 + auVar35._8_4_;
            fVar34 = fVar45 * 0.0 + fVar45 * 0.0 + auVar35._12_4_;
            fVar25 = fVar25 * fVar41 * 0.5;
            fVar26 = fVar26 * fVar43 * 0.5;
            fVar41 = extraout_XMM0_Db * fVar44 * 0.0;
            fVar43 = extraout_XMM0_Db_00 * fVar45 * 0.0;
            auVar27._0_4_ = fVar29 - fVar25;
            auVar27._4_4_ = fVar32 - fVar26;
            auVar27._8_4_ = fVar33 - fVar41;
            auVar27._12_4_ = fVar34 - fVar43;
            auVar39._4_4_ = fVar26 + fVar32;
            auVar39._0_4_ = fVar25 + fVar29;
            auVar39._8_4_ = fVar41 + fVar33;
            auVar39._12_4_ = fVar43 + fVar34;
            auVar30._0_8_ = CONCAT44((float)(local_1a0 + -1),(float)(iStack_19c + -1));
            auVar30._8_4_ = 0xbf800000;
            auVar30._12_4_ = 0xbf800000;
            auVar36._8_4_ = 0xbf800000;
            auVar36._0_8_ = auVar30._0_8_;
            auVar36._12_4_ = 0xbf800000;
            auVar35 = minps(auVar36,auVar27);
            auVar35 = maxps(ZEXT816(0),auVar35);
            auVar42 = minps(auVar30,auVar39);
            auVar42 = maxps(ZEXT816(0),auVar42);
            local_2b8.rect.width = (auVar42._0_4_ - auVar35._0_4_) + (float)DAT_00316020;
            local_2b8.rect.height = (auVar42._4_4_ - auVar35._4_4_) + DAT_00316020._4_4_;
            local_2b8.rect._0_8_ = auVar35._0_8_;
            local_2b8.label = iVar14;
            local_2b8.prob = fVar37;
            std::vector<Object,_std::allocator<Object>_>::push_back
                      (class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + iVar14,&local_2b8);
          }
          piVar10 = (int *)CONCAT44(cls_prob.refcount._4_4_,cls_prob.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (cls_prob.allocator == (Allocator *)0x0) {
                if (cls_prob.data != (void *)0x0) {
                  free(cls_prob.data);
                }
              }
              else {
                (*(cls_prob.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          cls_prob.cstep = 0;
          cls_prob.data = (void *)0x0;
          cls_prob.refcount._0_4_ = 0;
          cls_prob.refcount._4_4_ = 0;
          cls_prob.elemsize._0_4_ = 0;
          cls_prob._20_8_ = 0;
          cls_prob.dims = 0;
          cls_prob.w = 0;
          cls_prob.h = 0;
          cls_prob.d = 0;
          cls_prob.c = 0;
          piVar10 = (int *)CONCAT44(bbox_pred.refcount._4_4_,bbox_pred.refcount._0_4_);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (bbox_pred.allocator == (Allocator *)0x0) {
                if (bbox_pred.data != (void *)0x0) {
                  free(bbox_pred.data);
                }
              }
              else {
                (*(bbox_pred.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          bbox_pred.cstep = 0;
          bbox_pred.data = (void *)0x0;
          bbox_pred.refcount._0_4_ = 0;
          bbox_pred.refcount._4_4_ = 0;
          bbox_pred.elemsize._0_4_ = 0;
          bbox_pred.elemsize._4_4_ = 0;
          bbox_pred.elempack = 0;
          bbox_pred.dims = 0;
          bbox_pred.w = 0;
          bbox_pred.h = 0;
          bbox_pred.d = 0;
          bbox_pred.c = 0;
          piVar10 = (int *)CONCAT44(m_1.refcount._4_4_,(int)m_1.refcount);
          if (piVar10 != (int *)0x0) {
            LOCK();
            *piVar10 = *piVar10 + -1;
            UNLOCK();
            if (*piVar10 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                if (m_1.data != (void *)0x0) {
                  free(m_1.data);
                }
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          m_1.cstep = 0;
          m_1.data = (void *)0x0;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = 0;
          m_1.elemsize._4_4_ = 0;
          m_1.elempack = 0;
          m_1.dims = 0;
          m_1.w = 0;
          m_1.h = 0;
          m_1.d = 0;
          m_1.c = 0;
          ncnn::Extractor::~Extractor(&ex2);
          lVar21 = lVar21 + 1;
        } while (lVar21 < rois.c);
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (0 < (int)((ulong)((long)class_candidates.
                                  super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)class_candidates.
                                 super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
        lVar21 = 0;
        do {
          objects_00 = class_candidates.
                       super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + lVar21;
          pOVar7 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          pOVar8 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (pOVar7 != pOVar8) {
            qsort_descent_inplace
                      (objects_00,0,
                       (int)((ulong)((long)pOVar8 - (long)pOVar7) >> 3) * -0x55555555 + -1);
          }
          bbox_pred.data = (void *)0x0;
          bbox_pred.elemsize._0_4_ = 0;
          bbox_pred.elemsize._4_4_ = 0;
          bbox_pred.refcount._4_4_ = 0;
          bbox_pred.refcount._0_4_ = 0;
          uVar23 = (int)((long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
          std::vector<float,_std::allocator<float>_>::vector
                    ((vector<float,_std::allocator<float>_> *)&m_1,(long)(int)uVar23,
                     (allocator_type *)&cls_prob);
          if ((int)uVar23 < 1) {
            cls_prob.data = (void *)((ulong)cls_prob.data._4_4_ << 0x20);
          }
          else {
            pfVar17 = &(((objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start)->rect).height;
            uVar16 = 0;
            do {
              *(float *)((long)m_1.data + uVar16 * 4) = pfVar17[-1] * *pfVar17;
              uVar16 = uVar16 + 1;
              pfVar17 = pfVar17 + 6;
            } while ((uVar23 & 0x7fffffff) != uVar16);
            cls_prob.data = (void *)((ulong)cls_prob.data._4_4_ << 0x20);
            iVar14 = 0;
            do {
              uVar19 = (uint)((ulong)((long)bbox_pred.refcount - (long)bbox_pred.data) >> 2);
              if ((int)uVar19 < 1) {
LAB_0013c86e:
                if (bbox_pred.refcount ==
                    (int *)CONCAT44(bbox_pred.elemsize._4_4_,(undefined4)bbox_pred.elemsize)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&bbox_pred,
                             (iterator)bbox_pred.refcount,(int *)&cls_prob);
                }
                else {
                  *bbox_pred.refcount = iVar14;
                  bbox_pred.refcount = bbox_pred.refcount + 1;
                }
              }
              else {
                pOVar7 = (objects_00->super__Vector_base<Object,_std::allocator<Object>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                lVar15 = (long)iVar14;
                uVar16._0_4_ = pOVar7[lVar15].rect.x;
                uVar16._4_4_ = pOVar7[lVar15].rect.y;
                auVar28._8_8_ = 0;
                auVar28._0_8_ = uVar16;
                uVar2 = pOVar7[lVar15].rect.width;
                uVar4 = pOVar7[lVar15].rect.height;
                auVar31._0_4_ = (float)uVar2 + (float)(undefined4)uVar16;
                auVar31._4_4_ = (float)uVar4 + (float)uVar16._4_4_;
                auVar31._8_8_ = 0;
                bVar11 = true;
                uVar16 = 0;
                do {
                  lVar20 = (long)*(int *)((long)bbox_pred.data + uVar16 * 4);
                  uVar24._0_4_ = pOVar7[lVar20].rect.x;
                  uVar24._4_4_ = pOVar7[lVar20].rect.y;
                  auVar40._8_8_ = 0;
                  auVar40._0_8_ = uVar24;
                  uVar3 = pOVar7[lVar20].rect.width;
                  uVar5 = pOVar7[lVar20].rect.height;
                  auVar38._0_4_ = (float)uVar3 + (float)(undefined4)uVar24;
                  auVar38._4_4_ = (float)uVar5 + (float)uVar24._4_4_;
                  auVar38._8_8_ = 0;
                  auVar42 = maxps(auVar40,auVar28);
                  auVar35 = minps(auVar38,auVar31);
                  fVar37 = auVar35._0_4_ - auVar42._0_4_;
                  fVar25 = auVar35._4_4_ - auVar42._4_4_;
                  fVar26 = 0.0;
                  if (0.0 < fVar25 && 0.0 < fVar37) {
                    fVar26 = fVar37 * fVar25;
                  }
                  if (0.3 < fVar26 / ((*(float *)((long)m_1.data + lVar20 * 4) +
                                      *(float *)((long)m_1.data + lVar15 * 4)) - fVar26)) {
                    bVar11 = false;
                  }
                  uVar16 = uVar16 + 1;
                } while ((uVar19 & 0x7fffffff) != uVar16);
                if (bVar11) goto LAB_0013c86e;
              }
              iVar14 = (int)cls_prob.data + 1;
              cls_prob.data = (void *)CONCAT44(cls_prob.data._4_4_,iVar14);
            } while (iVar14 < (int)uVar23);
          }
          if (m_1.data != (void *)0x0) {
            operator_delete(m_1.data);
          }
          if (0 < (int)((ulong)((long)bbox_pred.refcount - (long)bbox_pred.data) >> 2)) {
            lVar15 = 0;
            do {
              std::vector<Object,_std::allocator<Object>_>::push_back
                        (&objects,(objects_00->super__Vector_base<Object,_std::allocator<Object>_>).
                                  _M_impl.super__Vector_impl_data._M_start +
                                  *(int *)((long)bbox_pred.data + lVar15 * 4));
              lVar15 = lVar15 + 1;
            } while (lVar15 < (int)((ulong)((long)bbox_pred.refcount - (long)bbox_pred.data) >> 2));
          }
          if (bbox_pred.data != (void *)0x0) {
            operator_delete(bbox_pred.data);
          }
          lVar21 = lVar21 + 1;
        } while (lVar21 < (int)((ulong)((long)class_candidates.
                                              super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)class_candidates.
                                             super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                          -0x55555555);
      }
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&objects,0,
                   (int)((ulong)((long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                (long)objects.super__Vector_base<Object,_std::allocator<Object>_>.
                                      _M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555
                   + -1);
      }
      if (100 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                         (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
        std::vector<Object,_std::allocator<Object>_>::resize(&objects,100);
      }
      std::
      vector<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
      ::~vector(&class_candidates);
      piVar10 = (int *)CONCAT44(rois.refcount._4_4_,(int)rois.refcount);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (rois.allocator == (Allocator *)0x0) {
            if (rois.data != (void *)0x0) {
              free(rois.data);
            }
          }
          else {
            (*(rois.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(rfcn_bbox.refcount._4_4_,rfcn_bbox.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (rfcn_bbox.allocator == (Allocator *)0x0) {
            if (rfcn_bbox.data != (void *)0x0) {
              free(rfcn_bbox.data);
            }
          }
          else {
            (*(rfcn_bbox.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(rfcn_cls.refcount._4_4_,rfcn_cls.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (rfcn_cls.allocator == (Allocator *)0x0) {
            if (rfcn_cls.data != (void *)0x0) {
              free(rfcn_cls.data);
            }
          }
          else {
            (*(rfcn_cls.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Extractor::~Extractor(&ex1);
      piVar10 = (int *)CONCAT44(im_info.refcount._4_4_,im_info.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (im_info.allocator == (Allocator *)0x0) {
            if (im_info.data != (void *)0x0) {
              free(im_info.data);
            }
          }
          else {
            (*(im_info.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(in.refcount._4_4_,in.refcount._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (in.allocator == (Allocator *)0x0) {
            if (in.data != (void *)0x0) {
              free(in.data);
            }
          }
          else {
            (*(in.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&rfcn);
      cv::Mat::clone();
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        lVar21 = 0;
        uVar16 = 0;
        do {
          pOVar7 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                   super__Vector_impl_data._M_start;
          fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                  (double)*(float *)((long)&(objects.
                                             super__Vector_base<Object,_std::allocator<Object>_>.
                                             _M_impl.super__Vector_impl_data._M_start)->prob +
                                    lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                    lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                    lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).width
                                    + lVar21),
                  (double)*(float *)((long)&((objects.
                                              super__Vector_base<Object,_std::allocator<Object>_>.
                                              _M_impl.super__Vector_impl_data._M_start)->rect).
                                            height + lVar21),
                  (ulong)*(uint *)((long)&(objects.
                                           super__Vector_base<Object,_std::allocator<Object>_>.
                                           _M_impl.super__Vector_impl_data._M_start)->label + lVar21
                                  ));
          im_info.elemsize._0_4_ = 0;
          im_info.elemsize._4_4_ = 0;
          im_info.data = (void *)CONCAT44(im_info.data._4_4_,0x3010000);
          rois.refcount._0_4_ = (int)ROUND(*(float *)((long)&(pOVar7->rect).width + lVar21));
          rois.refcount._4_4_ = (int)ROUND(*(float *)((long)&(pOVar7->rect).height + lVar21));
          rois.data = (void *)CONCAT44((int)ROUND(*(float *)((long)&(pOVar7->rect).y + lVar21)),
                                       (int)ROUND(*(float *)((long)&(pOVar7->rect).x + lVar21)));
          rfcn._vptr_Net = (_func_int **)0x406fe00000000000;
          rfcn.opt.lightmode = false;
          rfcn.opt._1_3_ = 0;
          rfcn.opt.num_threads = 0;
          rfcn.opt.blob_allocator = (Allocator *)0x0;
          rfcn.opt.workspace_allocator = (Allocator *)0x0;
          im_info.refcount = (int *)&in;
          cv::rectangle(&im_info,&rois,&rfcn,1,8,0);
          sprintf((char *)&rfcn,"%s %.1f%%",
                  (double)(*(float *)((long)&pOVar7->prob + lVar21) * 100.0),
                  _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                  *(int *)(
                          _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                          + (long)*(int *)((long)&pOVar7->label + lVar21) * 4));
          class_candidates.
          super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)((ulong)class_candidates.
                                super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
          im_info.data = &im_info.elemsize;
          sVar18 = strlen((char *)&rfcn);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&im_info,&rfcn,(long)&rfcn._vptr_Net + sVar18);
          cv::getTextSize((string *)&bbox_pred,(int)&im_info,0.5,0,(int *)0x1);
          if ((size_t *)im_info.data != &im_info.elemsize) {
            operator_delete(im_info.data);
          }
          iVar14 = (int)*(float *)((long)&(pOVar7->rect).x + lVar21);
          iVar22 = (int)((*(float *)((long)&(pOVar7->rect).y + lVar21) - (float)bbox_pred.data._4_4_
                         ) - (float)(int)class_candidates.
                                         super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
          if (iVar22 < 1) {
            iVar22 = 0;
          }
          iVar9 = in.refcount._4_4_ - (int)bbox_pred.data;
          if ((int)bbox_pred.data + iVar14 <= in.refcount._4_4_) {
            iVar9 = iVar14;
          }
          rfcn_bbox.elemsize._0_4_ = 0;
          rfcn_bbox.elemsize._4_4_ = 0;
          rfcn_bbox.data = (void *)CONCAT44(rfcn_bbox.data._4_4_,0x3010000);
          m_1.refcount._4_4_ =
               (int)class_candidates.
                    super__Vector_base<std::vector<Object,_std::allocator<Object>_>,_std::allocator<std::vector<Object,_std::allocator<Object>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + bbox_pred.data._4_4_;
          m_1.data = (void *)CONCAT44(iVar22,iVar9);
          m_1.refcount._0_4_ = (int)bbox_pred.data;
          im_info.data = (void *)0x406fe00000000000;
          im_info.refcount._0_4_ = 0;
          im_info.refcount._4_4_ = 0x406fe000;
          im_info.elemsize._0_4_ = 0;
          im_info.elemsize._4_4_ = 0x406fe000;
          im_info.elempack = 0;
          im_info._28_4_ = 0;
          rfcn_bbox.refcount = (int *)&in;
          cv::rectangle(&rfcn_bbox,&m_1,&im_info,0xffffffff,8,0);
          rfcn_bbox.elemsize._0_4_ = 0;
          rfcn_bbox.elemsize._4_4_ = 0;
          rfcn_bbox.data = (void *)CONCAT44(rfcn_bbox.data._4_4_,0x3010000);
          im_info.data = &im_info.elemsize;
          rfcn_bbox.refcount = (int *)&in;
          sVar18 = strlen((char *)&rfcn);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&im_info,&rfcn,(long)&rfcn._vptr_Net + sVar18);
          cls_prob.data = (void *)CONCAT44(iVar22 + bbox_pred.data._4_4_,iVar9);
          rfcn_cls.data = (void *)0x0;
          rfcn_cls.refcount._0_4_ = 0;
          rfcn_cls.refcount._4_4_ = 0;
          rfcn_cls.elemsize._0_4_ = 0;
          rfcn_cls.elemsize._4_4_ = 0;
          rfcn_cls.elempack = 0;
          rfcn_cls._28_4_ = 0;
          cv::putText(0x3fe0000000000000,&rfcn_bbox,&im_info,&cls_prob,0,&rfcn_cls,1,8,0);
          if ((size_t *)im_info.data != &im_info.elemsize) {
            operator_delete(im_info.data);
          }
          uVar16 = uVar16 + 1;
          lVar21 = lVar21 + 0x18;
        } while (uVar16 < (ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555));
      }
      im_info.refcount = (int *)&in;
      ppAVar1 = &rfcn.opt.blob_allocator;
      rfcn.opt.blob_allocator = (Allocator *)CONCAT26(rfcn.opt.blob_allocator._6_2_,0x6567616d69);
      rfcn.opt.lightmode = true;
      rfcn.opt._1_3_ = 0;
      rfcn.opt.num_threads = 0;
      im_info.elemsize._0_4_ = 0;
      im_info.elemsize._4_4_ = 0;
      im_info.data = (void *)CONCAT44(im_info.data._4_4_,0x1010000);
      rfcn._vptr_Net = (_func_int **)ppAVar1;
      cv::imshow((string *)&rfcn,(_InputArray *)&im_info);
      if ((Allocator **)rfcn._vptr_Net != ppAVar1) {
        operator_delete(rfcn._vptr_Net);
      }
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar14 = 0;
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar6);
      iVar14 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    main_cold_1();
    iVar14 = -1;
  }
  return iVar14;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_rfcn(m, objects);

    draw_objects(m, objects);

    return 0;
}